

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

mbedtls_ct_condition_t
mbedtls_mpi_core_uint_le_mpi(mbedtls_mpi_uint min,mbedtls_mpi_uint *A,size_t A_limbs)

{
  mbedtls_ct_condition_t mVar1;
  mbedtls_ct_condition_t y;
  ulong local_38;
  size_t i;
  mbedtls_ct_condition_t msll_mask;
  mbedtls_ct_condition_t min_le_lsl;
  size_t A_limbs_local;
  mbedtls_mpi_uint *A_local;
  mbedtls_mpi_uint min_local;
  
  mVar1 = mbedtls_ct_uint_ge(*A,min);
  i = mbedtls_ct_compiler_opaque(0);
  for (local_38 = 1; local_38 < A_limbs; local_38 = local_38 + 1) {
    y = mbedtls_ct_bool(A[local_38]);
    i = mbedtls_ct_bool_or(i,y);
  }
  mVar1 = mbedtls_ct_bool_or(i,mVar1);
  return mVar1;
}

Assistant:

mbedtls_ct_condition_t mbedtls_mpi_core_uint_le_mpi(mbedtls_mpi_uint min,
                                                    const mbedtls_mpi_uint *A,
                                                    size_t A_limbs)
{
    /* min <= least significant limb? */
    mbedtls_ct_condition_t min_le_lsl = mbedtls_ct_uint_ge(A[0], min);

    /* limbs other than the least significant one are all zero? */
    mbedtls_ct_condition_t msll_mask = MBEDTLS_CT_FALSE;
    for (size_t i = 1; i < A_limbs; i++) {
        msll_mask = mbedtls_ct_bool_or(msll_mask, mbedtls_ct_bool(A[i]));
    }

    /* min <= A iff the lowest limb of A is >= min or the other limbs
     * are not all zero. */
    return mbedtls_ct_bool_or(msll_mask, min_le_lsl);
}